

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lambertian.h
# Opt level: O3

RGBColor __thiscall
pm::Lambertian::sampleF(Lambertian *this,ShadeRecord *sr,Vector3 *wo,Vector3 *wi,float *pdf)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float *in_R9;
  float fVar7;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  RGBColor RVar13;
  Vector3 sp;
  unsigned_long local_40;
  float local_38;
  
  fVar9 = wo[4].x;
  uVar1 = wo[3].y;
  uVar3 = wo[3].z;
  fVar10 = fVar9 - (float)uVar3 * 0.0071;
  fVar11 = (float)uVar1 * 0.0071 + fVar9 * -0.0034;
  fVar12 = (float)uVar3 * 0.0034 - (float)uVar1;
  fVar8 = SQRT(fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11);
  fVar10 = fVar10 / fVar8;
  fVar11 = fVar11 / fVar8;
  fVar12 = fVar12 / fVar8;
  SamplerState::sampleHemisphere((SamplerState *)&stack0xffffffffffffffc0);
  fVar8 = (float)local_40;
  fVar7 = (float)(local_40 >> 0x20);
  auVar5._0_4_ = local_38 * (float)uVar1 +
                 (fVar11 * fVar9 - (float)uVar3 * fVar12) * fVar8 + fVar10 * fVar7;
  auVar5._4_4_ = local_38 * (float)uVar3 +
                 fVar11 * fVar7 + (fVar12 * (float)uVar1 - fVar9 * fVar10) * fVar8;
  auVar5._8_4_ = local_38 * 0.0 + 0.0;
  auVar5._12_4_ = local_38 * 0.0 + 0.0;
  fVar8 = fVar9 * local_38 +
          fVar12 * fVar7 + (fVar10 * (float)uVar3 - (float)uVar1 * fVar11) * fVar8;
  fVar9 = SQRT(fVar8 * fVar8 + auVar5._0_4_ * auVar5._0_4_ + auVar5._4_4_ * auVar5._4_4_);
  auVar6._4_4_ = fVar9;
  auVar6._0_4_ = fVar9;
  auVar6._8_4_ = fVar9;
  auVar6._12_4_ = fVar9;
  auVar6 = divps(auVar5,auVar6);
  *(long *)pdf = auVar6._0_8_;
  pdf[2] = fVar8 / fVar9;
  *in_R9 = ((fVar8 / fVar9) * wo[4].x + auVar6._0_4_ * wo[3].y + auVar6._4_4_ * wo[3].z) *
           0.31830987;
  uVar2 = (sr->localHitPoint).y;
  uVar4 = (sr->localHitPoint).z;
  RVar13.b = (float)uVar2 * (sr->normal).y * 0.31830987;
  (this->super_BRDF)._vptr_BRDF =
       (_func_int **)
       CONCAT44((sr->normal).x * (float)uVar2 * 0.31830987,(float)uVar2 * (float)uVar4 * 0.31830987)
  ;
  *(float *)&(this->super_BRDF).samplerState_.count_ = RVar13.b;
  RVar13.r = 0.31830987;
  RVar13.g = 0.0;
  return RVar13;
}

Assistant:

inline RGBColor Lambertian::sampleF(const ShadeRecord &sr, const Vector3 &wo, Vector3 &wi, float &pdf) const
{
	const Vector3 w = sr.normal;
	// jitter the up vector in case normal is vertical
	Vector3 v = cross(Vector3(0.0034f, 1.0f, 0.0071f), w);
	v.normalize();
	const Vector3 u = cross(v, w);

	const Vector3 sp = samplerState_.sampleHemisphere();
	wi = sp.x * u + sp.y * v + sp.z * w;
	wi.normalize();

	pdf = dot(sr.normal, wi) * invPi;

	return (kd_ * cd_ * invPi);
}